

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# automaton.c
# Opt level: O2

ssize_t MAFSA_automaton_search
                  (MAFSA_automaton ma,MAFSA_letter *l,size_t sz_l,MAFSA_letter *out,size_t sz_out,
                  size_t *sz_out_result)

{
  uint32_t *puVar1;
  uint32_t uVar2;
  uint32_t *puVar3;
  ulong uVar4;
  ulong __n;
  ulong uVar5;
  
  uVar5 = 0;
  do {
    if (uVar5 == sz_l) {
      return -1;
    }
    uVar4 = uVar5 & 0xffffffff;
    puVar1 = ma->ptr_nodes;
    puVar3 = puVar1;
    while ((uVar2 = *puVar3, uVar4 < sz_l && (-1 < (int)uVar2))) {
      uVar2 = MAFSA_delta(ma->ptr_links,uVar2,l[uVar4]);
      if (uVar2 == 0) goto LAB_001017c6;
      uVar4 = (ulong)((int)uVar4 + 1);
      puVar3 = puVar1 + uVar2;
    }
    if ((int)uVar2 < 0) {
      __n = uVar4 - uVar5;
      if (sz_out <= uVar4 - uVar5) {
        __n = sz_out;
      }
      memcpy(out,l + uVar5,__n);
      if (sz_out_result == (size_t *)0x0) {
        return uVar5;
      }
      *sz_out_result = __n;
      return uVar5;
    }
LAB_001017c6:
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

extern ssize_t MAFSA_automaton_search(MAFSA_automaton ma, const MAFSA_letter *l, size_t sz_l,
    MAFSA_letter *out, size_t sz_out, size_t *sz_out_result)
{
    ssize_t cur_pos;

    for (cur_pos = 0; cur_pos < sz_l; cur_pos++)
    {
        uint32_t i = cur_pos;
        uint32_t current = ma->ptr_nodes[0];
        uint32_t where = 0;

        while (i < sz_l && !node_is_final(current))
        {
            MAFSA_letter label = l[i++];

            if (0 != (where = MAFSA_delta(ma->ptr_links, current, label)))
            {
                current = ma->ptr_nodes[where];
            }
            else
            {
                break;
            }
        }

        if (node_is_final(current))
        {
            ssize_t cpy_sz;
            
            cpy_sz = i - cur_pos < sz_out ? i - cur_pos : sz_out;
            memcpy(out, l + cur_pos, cpy_sz);

            if (sz_out_result)
            {
                *sz_out_result = cpy_sz;
            }

            return cur_pos;
        }
    }

    return -1;
}